

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DefaultRowEst(Index *pIdx)

{
  short *psVar1;
  long in_RDI;
  int i;
  int nCopy;
  LogEst x;
  LogEst *a;
  uint local_20;
  uint local_1c;
  short local_12;
  
  psVar1 = *(short **)(in_RDI + 0x10);
  if (*(ushort *)(in_RDI + 0x5e) < 6) {
    local_20 = (uint)*(ushort *)(in_RDI + 0x5e);
  }
  else {
    local_20 = 5;
  }
  local_12 = *(short *)(*(long *)(in_RDI + 0x18) + 0x3a);
  if (local_12 < 99) {
    local_12 = 99;
    *(undefined2 *)(*(long *)(in_RDI + 0x18) + 0x3a) = 99;
  }
  if (*(long *)(in_RDI + 0x48) != 0) {
    local_12 = local_12 + -10;
  }
  *psVar1 = local_12;
  memcpy(psVar1 + 1,sqlite3DefaultRowEst::aVal,(long)(int)local_20 << 1);
  while (local_1c = local_20 + 1, (int)local_1c <= (int)(uint)*(ushort *)(in_RDI + 0x5e)) {
    psVar1[(int)local_1c] = 0x17;
    local_20 = local_1c;
  }
  if (*(char *)(in_RDI + 0x62) != '\0') {
    psVar1[*(ushort *)(in_RDI + 0x5e)] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
               /*                10,  9,  8,  7,  6 */
  static const LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  LogEst x;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Indexes with default row estimates should not have stat1 data */
  assert( !pIdx->hasStat1 );

  /* Set the first entry (number of rows in the index) to the estimated
  ** number of rows in the table, or half the number of rows in the table
  ** for a partial index.
  **
  ** 2020-05-27:  If some of the stat data is coming from the sqlite_stat1
  ** table but other parts we are having to guess at, then do not let the
  ** estimated number of rows in the table be less than 1000 (LogEst 99).
  ** Failure to do this can cause the indexes for which we do not have
  ** stat1 data to be ignored by the query planner.
  */
  x = pIdx->pTable->nRowLogEst;
  assert( 99==sqlite3LogEst(1000) );
  if( x<99 ){
    pIdx->pTable->nRowLogEst = x = 99;
  }
  if( pIdx->pPartIdxWhere!=0 ){ x -= 10;  assert( 10==sqlite3LogEst(2) ); }
  a[0] = x;

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}